

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void __thiscall NAPComm::finalize(NAPComm *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  long *in_RDI;
  int max_n;
  int tmp;
  int local_10;
  
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(*(long *)*in_RDI + 4);
  if ((int)in_RDI[4] < *(int *)(*(long *)in_RDI[2] + 4)) {
    *(int *)(in_RDI + 4) = *(int *)(*(long *)in_RDI[2] + 4);
  }
  if ((int)in_RDI[4] < *(int *)(*(long *)in_RDI[1] + 4)) {
    *(int *)(in_RDI + 4) = *(int *)(*(long *)in_RDI[1] + 4);
  }
  if ((int)in_RDI[4] < *(int *)(*(long *)in_RDI[3] + 4)) {
    *(int *)(in_RDI + 4) = *(int *)(*(long *)in_RDI[3] + 4);
  }
  local_10 = **(int **)*in_RDI + **(int **)in_RDI[3];
  if (**(int **)*in_RDI + **(int **)in_RDI[3] < **(int **)in_RDI[2]) {
    local_10 = **(int **)in_RDI[2];
  }
  if (local_10 < **(int **)in_RDI[1]) {
    local_10 = **(int **)in_RDI[1];
  }
  if (local_10 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_10;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[5] = (long)pvVar4;
  }
  local_10 = **(int **)(*in_RDI + 8) + **(int **)(in_RDI[3] + 8);
  if (local_10 < **(int **)(in_RDI[2] + 8)) {
    local_10 = **(int **)(in_RDI[2] + 8);
  }
  if (local_10 < **(int **)(in_RDI[1] + 8)) {
    local_10 = **(int **)(in_RDI[1] + 8);
  }
  if (local_10 != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_10;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[6] = (long)pvVar4;
  }
  return;
}

Assistant:

void finalize()
    {
        int tmp, max_n;

        // Find max size sent (for send_buffer)
        buffer_size = local_L_comm->send_data->size_msgs;
        tmp = local_S_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;
        tmp = local_R_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;
        tmp = global_comm->send_data->size_msgs;
        if (tmp > buffer_size) buffer_size = tmp;

        // Find max number sent and recd
        max_n = local_L_comm->send_data->num_msgs + 
            global_comm->send_data->num_msgs;
        tmp = local_S_comm->send_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        tmp = local_R_comm->send_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        if (max_n) send_requests = new MPI_Request[max_n];

        // Find max number sent and recd
        max_n = local_L_comm->recv_data->num_msgs + 
            global_comm->recv_data->num_msgs;
        tmp = local_S_comm->recv_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        tmp = local_R_comm->recv_data->num_msgs;
        if (tmp > max_n) max_n = tmp;
        if (max_n) recv_requests = new MPI_Request[max_n];
    }